

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_new_connection_id
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  int iVar1;
  quicly_local_cid_set_t *set;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  uint64_t sequence;
  quicly_conn_t *conn;
  uint64_t in_stack_ffffffffffffffc8;
  
  set = (quicly_local_cid_set_t *)(in_RDI + -0x630);
  if (in_EDX == 0) {
    iVar1 = quicly_local_cid_on_lost(set,(uint64_t)*(quicly_local_cid_set_t **)(in_RCX + 8));
    if (iVar1 != 0) {
      set[7].cids[3].field_0x4 = set[7].cids[3].field_0x4 | 0x80;
    }
  }
  else {
    quicly_local_cid_on_acked(*(quicly_local_cid_set_t **)(in_RCX + 8),in_stack_ffffffffffffffc8);
  }
  return 0;
}

Assistant:

static int on_ack_new_connection_id(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    uint64_t sequence = sent->data.new_connection_id.sequence;

    if (acked) {
        quicly_local_cid_on_acked(&conn->super.local.cid_set, sequence);
    } else {
        if (quicly_local_cid_on_lost(&conn->super.local.cid_set, sequence))
            conn->egress.pending_flows |= QUICLY_PENDING_FLOW_CID_FRAME_BIT;
    }

    return 0;
}